

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void traversestack(global_State *g,lua_State *l)

{
  CallInfo *local_30;
  CallInfo *ci;
  StkId lim;
  StkId o;
  lua_State *l_local;
  global_State *g_local;
  
  if ((3 < (l->l_gt).tt) && (((((l->l_gt).value.gc)->gch).marked & 3) != 0)) {
    reallymarkobject(g,(l->l_gt).value.gc);
  }
  ci = (CallInfo *)l->top;
  for (local_30 = l->base_ci; local_30 <= l->ci; local_30 = local_30 + 1) {
    if (ci < (CallInfo *)local_30->top) {
      ci = (CallInfo *)local_30->top;
    }
  }
  for (lim = l->stack; lim < l->top; lim = lim + 1) {
    if ((3 < lim->tt) && (((((lim->value).gc)->gch).marked & 3) != 0)) {
      reallymarkobject(g,(lim->value).gc);
    }
  }
  for (; lim <= ci; lim = lim + 1) {
    lim->tt = 0;
  }
  checkstacksizes(l,(StkId)ci);
  return;
}

Assistant:

static void traversestack(global_State*g,lua_State*l){
StkId o,lim;
CallInfo*ci;
markvalue(g,gt(l));
lim=l->top;
for(ci=l->base_ci;ci<=l->ci;ci++){
if(lim<ci->top)lim=ci->top;
}
for(o=l->stack;o<l->top;o++)
markvalue(g,o);
for(;o<=lim;o++)
setnilvalue(o);
checkstacksizes(l,lim);
}